

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpIntNegate::TypeOpIntNegate(TypeOpIntNegate *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpIntNegate *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"~",&local_39);
  TypeOpUnary::TypeOpUnary
            (&this->super_TypeOpUnary,t,CPUI_INT_NEGATE,(string *)local_38,TYPE_UINT,TYPE_UINT);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpUnary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084b6b8;
  (this->super_TypeOpUnary).super_TypeOp.opflags = 0x8000;
  (this->super_TypeOpUnary).super_TypeOp.addlflags = 1;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehaviorIntNegate::OpBehaviorIntNegate((OpBehaviorIntNegate *)this_00);
  (this->super_TypeOpUnary).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpIntNegate::TypeOpIntNegate(TypeFactory *t)
  : TypeOpUnary(t,CPUI_INT_NEGATE,"~",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::unary;
  addlflags = inherits_sign;
  behave = new OpBehaviorIntNegate();
}